

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

void __thiscall
t_haxe_generator::generate_serialize_map_element
          (t_haxe_generator *this,ostream *out,t_map *tmap,string *iter,string *map)

{
  t_type *ptVar1;
  allocator local_269;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  t_field vfield;
  string local_130;
  string local_100;
  undefined1 local_e0 [8];
  t_field kfield;
  string *map_local;
  string *iter_local;
  t_map *tmap_local;
  ostream *out_local;
  t_haxe_generator *this_local;
  
  kfield._168_8_ = map;
  ptVar1 = t_map::get_key_type(tmap);
  std::__cxx11::string::string((string *)&local_100,(string *)iter);
  t_field::t_field((t_field *)local_e0,ptVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"",(allocator *)&vfield.field_0xaf);
  generate_serialize_field(this,out,(t_field *)local_e0,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&vfield.field_0xaf);
  ptVar1 = t_map::get_val_type(tmap);
  std::operator+(&local_248,map,".get(");
  std::operator+(&local_228,&local_248,iter);
  std::operator+(&local_208,&local_228,")");
  t_field::t_field((t_field *)local_1e8,ptVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"",&local_269);
  generate_serialize_field(this,out,(t_field *)local_1e8,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  t_field::~t_field((t_field *)local_1e8);
  t_field::~t_field((t_field *)local_e0);
  return;
}

Assistant:

void t_haxe_generator::generate_serialize_map_element(ostream& out,
                                                      t_map* tmap,
                                                      string iter,
                                                      string map) {
  t_field kfield(tmap->get_key_type(), iter);
  generate_serialize_field(out, &kfield, "");
  t_field vfield(tmap->get_val_type(), map + ".get(" + iter + ")");
  generate_serialize_field(out, &vfield, "");
}